

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

short wabt::interp::SaturatingRoundingQMul<short>(short lhs,short rhs)

{
  short sVar1;
  int64_t product;
  int round_const;
  int size_in_bits;
  short rhs_local;
  short lhs_local;
  
  sVar1 = Saturate<short,long>((long)((int)lhs * (int)rhs) + 0x4000 >> 0xf);
  return sVar1;
}

Assistant:

T WABT_VECTORCALL SaturatingRoundingQMul(T lhs, T rhs) {
  constexpr int size_in_bits = sizeof(T) * 8;
  int round_const = 1 << (size_in_bits - 2);
  int64_t product = lhs * rhs;
  product += round_const;
  product >>= (size_in_bits - 1);
  return Saturate<T, int64_t>(product);
}